

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O2

int SMPI_Allreduce(void *sendbuf,void *recvbuf,int count,SMPI_Datatype datatype,SMPI_Op op,
                  SMPI_Comm comm)

{
  string local_28;
  
  switch(datatype) {
  case SMPI_INT:
    if (op == SMPI_LAND) {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<int>
                (comm,(int *)sendbuf,(int *)recvbuf,(long)count,LogicalAnd,&local_28);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<int>
                (comm,(int *)sendbuf,(int *)recvbuf,(long)count,Max,&local_28);
    }
    break;
  case SMPI_LONG:
    if (op == SMPI_LAND) {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<long>
                (comm,(long *)sendbuf,(long *)recvbuf,(long)count,LogicalAnd,&local_28);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<long>
                (comm,(long *)sendbuf,(long *)recvbuf,(long)count,Max,&local_28);
    }
    break;
  case SMPI_SIZE_T:
    if (op == SMPI_LAND) {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<unsigned_long>
                (comm,(unsigned_long *)sendbuf,(unsigned_long *)recvbuf,(long)count,LogicalAnd,
                 &local_28);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<unsigned_long>
                (comm,(unsigned_long *)sendbuf,(unsigned_long *)recvbuf,(long)count,Max,&local_28);
    }
    break;
  case SMPI_CHAR:
    if (op == SMPI_LAND) {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<char>
                (comm,(char *)sendbuf,(char *)recvbuf,(long)count,LogicalAnd,&local_28);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<char>
                (comm,(char *)sendbuf,(char *)recvbuf,(long)count,Max,&local_28);
    }
    break;
  case SMPI_BYTE:
    if (op == SMPI_LAND) {
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<unsigned_char>
                (comm,(uchar *)sendbuf,(uchar *)recvbuf,(long)count,LogicalAnd,&local_28);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
      local_28._M_string_length = 0;
      local_28.field_2._M_local_buf[0] = '\0';
      adios2::helper::Comm::Allreduce<unsigned_char>
                (comm,(uchar *)sendbuf,(uchar *)recvbuf,(long)count,Max,&local_28);
    }
    break;
  default:
    goto switchD_006c7e04_default;
  }
  std::__cxx11::string::~string((string *)&local_28);
switchD_006c7e04_default:
  return 0;
}

Assistant:

int SMPI_Allreduce(const void *sendbuf, void *recvbuf, int count, SMPI_Datatype datatype,
                   SMPI_Op op, SMPI_Comm comm)
{
    switch (datatype)
    {
#define F(type)                                                                                    \
    SMPI_Allreduce_Impl(static_cast<const type *>(sendbuf), static_cast<type *>(recvbuf), count,   \
                        op, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}